

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostats.cpp
# Opt level: O0

ostream * foxxll::operator<<(ostream *o,stats *s)

{
  stats_data local_68;
  stats *local_18;
  stats *s_local;
  ostream *o_local;
  
  local_18 = s;
  s_local = (stats *)o;
  stats_data::stats_data(&local_68,s);
  operator<<(o,&local_68);
  stats_data::~stats_data(&local_68);
  return (ostream *)s_local;
}

Assistant:

std::ostream& operator << (std::ostream& o, const stats& s)
{
    o << stats_data(s);
    return o;
}